

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

void Action_add(action **app,e_action type,symbol *sp,char *arg)

{
  action *paVar1;
  action *newaction;
  char *arg_local;
  symbol *sp_local;
  e_action type_local;
  action **app_local;
  
  paVar1 = Action_new();
  paVar1->next = *app;
  *app = paVar1;
  paVar1->type = type;
  paVar1->sp = sp;
  paVar1->spOpt = (symbol *)0x0;
  if (type == SHIFT) {
    (paVar1->x).stp = (state *)arg;
  }
  else {
    (paVar1->x).stp = (state *)arg;
  }
  return;
}

Assistant:

void Action_add(
  struct action **app,
  enum e_action type,
  struct symbol *sp,
  char *arg
){
  struct action *newaction;
  newaction = Action_new();
  newaction->next = *app;
  *app = newaction;
  newaction->type = type;
  newaction->sp = sp;
  newaction->spOpt = 0;
  if( type==SHIFT ){
    newaction->x.stp = (struct state *)arg;
  }else{
    newaction->x.rp = (struct rule *)arg;
  }
}